

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

CURLcode ossl_connect_common(connectdata *conn,int sockindex,_Bool nonblocking,_Bool *done)

{
  ssl_connect_state sVar1;
  curl_proxytype cVar2;
  Curl_easy *pCVar3;
  Curl_easy *pCVar4;
  ENGINE *e;
  curl_ssl_ctx_callback p_Var5;
  _Bool _Var6;
  int iVar7;
  uint uVar8;
  CURLcode CVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  time_t tVar14;
  uint *puVar15;
  ulong uVar16;
  long lVar17;
  SSL_CIPHER *c;
  char *pcVar18;
  SSL_METHOD *meth;
  SSL_CTX *pSVar19;
  BIO_METHOD *pBVar20;
  stack_st_X509 *psVar21;
  BIO *pBVar22;
  X509 *pXVar23;
  X509_NAME *pXVar24;
  size_t sVar25;
  undefined8 uVar26;
  ASN1_INTEGER *pAVar27;
  ASN1_STRING *pAVar28;
  X509_EXTENSION *ex;
  BIO *out;
  ASN1_OBJECT *a;
  ASN1_OCTET_STRING *v;
  ASN1_TIME *pAVar29;
  EVP_PKEY *pEVar30;
  X509 *pXVar31;
  GENERAL_NAMES *a_00;
  int *piVar32;
  stack_st_X509 *__s;
  undefined8 extraout_RAX;
  size_t sVar33;
  PKCS12 *p12;
  X509_NAME_ENTRY *ne;
  SSL_SESSION *pSVar34;
  void *__src;
  OCSP_RESPONSE *resp;
  FILE *pFVar35;
  OCSP_BASICRESP *bs;
  X509_STORE *pXVar36;
  OCSP_SINGLERESP *single;
  X509_PUBKEY *pXVar37;
  SSL_SESSION *pSVar38;
  evp_pkey_st *from;
  UI_METHOD *method;
  UI_METHOD *pUVar39;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  X509_LOOKUP_METHOD *m;
  X509_LOOKUP *ctx;
  SSL *pSVar40;
  char cVar41;
  long lVar42;
  undefined7 uVar43;
  curl_socket_t writefd;
  long lVar44;
  size_t size;
  size_t size_00;
  SSL_SESSION *pSVar45;
  CURLcode CVar46;
  int iVar47;
  long lVar48;
  long lVar49;
  char cVar50;
  curl_socket_t readfd0;
  long lVar51;
  long lVar52;
  long lVar53;
  BIGNUM *bn;
  long lVar54;
  SSL_CTX *unaff_R12;
  ulong uVar55;
  ulong uVar56;
  byte bVar57;
  char *pcVar58;
  Curl_easy *pCVar59;
  size_t sVar60;
  bool bVar61;
  ssl_connect_data *connssl;
  char *ptr;
  in_addr addr;
  X509_ALGOR *palg;
  ASN1_BIT_STRING *psig;
  int crl_reason;
  X509 *x509;
  char error_buffer [256];
  ASN1_GENERALIZEDTIME *local_948;
  SSL_SESSION *local_940;
  EVP_PKEY *local_938;
  X509 *local_930;
  char *local_928;
  Curl_easy *local_920;
  stack_st_X509 *local_918;
  SSL_SESSION *local_910;
  SSL_CTX *local_908;
  Curl_easy *local_900;
  undefined8 local_8f8;
  ASN1_GENERALIZEDTIME *local_8f0;
  uint local_8e4;
  X509 *local_8e0;
  long local_8d8;
  SSL_SESSION *local_8d0;
  long local_8c8;
  _Bool *local_8c0;
  SSL_SESSION *local_8b8;
  X509 *local_8b0;
  SSL_SESSION local_838 [3];
  
  lVar13 = (long)sockindex;
  if (conn->ssl[lVar13].state == ssl_connection_complete) {
    *done = true;
    return CURLE_OK;
  }
  local_918 = (stack_st_X509 *)CONCAT44(local_918._4_4_,sockindex);
  pCVar59 = conn->data;
  local_930 = (X509 *)CONCAT44(local_930._4_4_,conn->sock[lVar13]);
  local_8c8 = lVar13;
  local_8c0 = done;
  if (conn->ssl[lVar13].connecting_state == ssl_connect_1) {
    tVar14 = Curl_timeleft(pCVar59,(timeval *)0x0,true);
    if (tVar14 < 0) {
LAB_0051106d:
      Curl_failf(pCVar59,"SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }
    cVar2 = (conn->http_proxy).proxytype;
    if ((cVar2 != CURLPROXY_HTTPS) ||
       (lVar48 = 0x160, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar48 = 0xd8;
    }
    if ((cVar2 != CURLPROXY_HTTPS) ||
       (lVar17 = 0x518, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar17 = 0x468;
    }
    if ((cVar2 != CURLPROXY_HTTPS) ||
       (lVar44 = 0x380, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar44 = 0x330;
    }
    if ((cVar2 != CURLPROXY_HTTPS) ||
       (lVar49 = 0x548, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar49 = 0x498;
    }
    if ((cVar2 != CURLPROXY_HTTPS) ||
       (lVar51 = 0x550, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar51 = 0x4a0;
    }
    if ((cVar2 != CURLPROXY_HTTPS) ||
       (lVar52 = 0x3a0, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar52 = 0x350;
    }
    if ((cVar2 != CURLPROXY_HTTPS) ||
       (lVar53 = 0x398, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar53 = 0x348;
    }
    if ((cVar2 != CURLPROXY_HTTPS) ||
       (lVar54 = 0x390, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar54 = 0x340;
    }
    pCVar3 = conn->data;
    if ((cVar2 != CURLPROXY_HTTPS) ||
       (lVar42 = 0x520, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar42 = 0x470;
    }
    local_920 = (Curl_easy *)CONCAT44(local_920._4_4_,conn->sock[local_8c8]);
    local_900 = *(Curl_easy **)((conn->chunk).hexbuffer + lVar48 + -0x20);
    uVar16 = *(ulong *)((conn->chunk).hexbuffer + lVar44 + -0x20);
    local_940 = *(SSL_SESSION **)((long)pCVar3->sockets + lVar49 + -0x80);
    pSVar34 = *(SSL_SESSION **)((long)pCVar3->sockets + lVar51 + -0x80);
    local_928 = *(char **)((conn->chunk).hexbuffer + lVar52 + -0x20);
    unaff_R12 = *(SSL_CTX **)((conn->chunk).hexbuffer + lVar53 + -0x20);
    bVar57 = (conn->chunk).hexbuffer[lVar54 + -0x20];
    pXVar23 = *(X509 **)((long)pCVar3->sockets + lVar42 + -0x80);
    local_8d8 = lVar13 * 5;
    CVar9 = Curl_ossl_seed(pCVar3);
    if (CVar9 != CURLE_OK) goto LAB_00511052;
    local_8f8 = CONCAT44(local_8f8._4_4_,(uint)bVar57);
    *(undefined8 *)((long)pCVar3->sockets + lVar17 + -0x80) = 1;
    local_908 = unaff_R12;
    local_8e0 = pXVar23;
    if (uVar16 < 8) {
      if ((0xf3UL >> (uVar16 & 0x3f) & 1) == 0) {
        if (uVar16 == 2) {
switchD_005111f3_caseD_2:
          pcVar58 = "OpenSSL was built without SSLv2 support";
        }
        else {
          pcVar58 = "OpenSSL was built without SSLv3 support";
        }
        Curl_failf(pCVar3,pcVar58);
        CVar9 = CURLE_NOT_BUILT_IN;
        goto LAB_00511052;
      }
      meth = (SSL_METHOD *)TLS_client_method();
      pSVar19 = (SSL_CTX *)conn->ssl[lVar13].ctx;
      if (pSVar19 != (SSL_CTX *)0x0) {
        SSL_CTX_free(pSVar19);
      }
      pSVar19 = SSL_CTX_new(meth);
      conn->ssl[lVar13].ctx = (SSL_CTX *)pSVar19;
      if (pSVar19 == (SSL_CTX *)0x0) {
        uVar16 = ERR_peek_error();
        ERR_error_string_n(uVar16,(char *)local_838,0x100);
        Curl_failf(pCVar3,"SSL: couldn\'t create a context: %s",local_838);
LAB_00511344:
        CVar9 = CURLE_OUT_OF_MEMORY;
      }
      else {
        SSL_CTX_ctrl(pSVar19,0x21,0x10,(void *)0x0);
        if (((pCVar3->set).fdebug != (curl_debug_callback)0x0) && ((pCVar3->set).verbose == true)) {
          SSL_CTX_set_msg_callback((SSL_CTX *)conn->ssl[lVar13].ctx,ssl_tls_trace);
          SSL_CTX_ctrl((SSL_CTX *)conn->ssl[lVar13].ctx,0x10,0,conn);
        }
        uVar55 = 0x80024850;
        cVar2 = (conn->http_proxy).proxytype;
        if ((cVar2 == CURLPROXY_HTTPS) &&
           (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
          cVar50 = (pCVar3->set).proxy_ssl.enable_beast;
        }
        else {
          cVar50 = (pCVar3->set).ssl.enable_beast;
        }
        if (cVar50 == '\0') {
          uVar55 = 0x80024050;
        }
        switch(uVar16) {
        case 0:
        case 1:
          uVar55 = uVar55 | 0x2000000;
          break;
        case 2:
          goto switchD_005111f3_caseD_2;
        case 3:
          uVar55 = uVar55 | 0x3c000000;
          break;
        case 4:
        case 5:
        case 6:
        case 7:
          if ((cVar2 != CURLPROXY_HTTPS) ||
             (lVar48 = 0x380, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar48 = 0x330;
          }
          lVar48 = *(long *)((conn->chunk).hexbuffer + lVar48 + -0x20);
          if ((cVar2 != CURLPROXY_HTTPS) ||
             (lVar17 = 0x388, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar17 = 0x338;
          }
          lVar17 = *(long *)((conn->chunk).hexbuffer + lVar17 + -0x20);
          lVar44 = lVar48 << 0x10;
          if (lVar17 != 0) {
            lVar44 = lVar17;
          }
          switch(lVar48) {
          case 7:
            SSL_CTX_ctrl((SSL_CTX *)(&conn->ssl[0].ctx)[local_8d8],0x7c,0x304,(void *)0x0);
            uVar55 = uVar55 | 0x8000000;
          case 6:
            uVar55 = uVar55 | 0x10000000;
          case 5:
            uVar55 = uVar55 | 0x4000000;
          case 4:
            uVar55 = uVar55 | 0x2000000;
          }
          switch(lVar44 << 0x30 | lVar44 - 0x10000U >> 0x10) {
          case 3:
            uVar55 = uVar55 | 0x10000000;
          case 4:
            uVar55 = uVar55 | 0x8000000;
          case 0:
          case 5:
            uVar55 = uVar55 | 0x20000000;
          }
          break;
        default:
          goto switchD_005111f3_default;
        }
        SSL_CTX_set_options(conn->ssl[lVar13].ctx,uVar55);
        if ((conn->bits).tls_enable_npn == true) {
          SSL_CTX_set_next_proto_select_cb
                    ((SSL_CTX *)conn->ssl[lVar13].ctx,select_next_proto_cb,conn);
        }
        if ((conn->bits).tls_enable_alpn == true) {
          local_838[0].ssl_version._0_1_ = 8;
          local_838[0]._1_7_ = 0x2e312f70747468;
          local_838[0].key_arg[0] = '1';
          Curl_infof(pCVar3,"ALPN, offering %s\n","http/1.1");
          SSL_CTX_set_alpn_protos(conn->ssl[lVar13].ctx,local_838,9);
        }
        if (local_940 != (SSL_SESSION *)0x0 || pSVar34 != (SSL_SESSION *)0x0) {
          cVar2 = (conn->http_proxy).proxytype;
          if ((cVar2 != CURLPROXY_HTTPS) ||
             (lVar48 = 0x558, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar48 = 0x4a8;
          }
          if ((cVar2 != CURLPROXY_HTTPS) ||
             (lVar17 = 0x560, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar17 = 0x4b0;
          }
          if ((cVar2 != CURLPROXY_HTTPS) ||
             (lVar44 = 0x568, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)
             ) {
            lVar44 = 0x4b8;
          }
          pSVar19 = (SSL_CTX *)conn->ssl[lVar13].ctx;
          local_8d0 = *(SSL_SESSION **)((long)pCVar3->sockets + lVar48 + -0x80);
          pSVar38 = *(SSL_SESSION **)((long)pCVar3->sockets + lVar17 + -0x80);
          bVar61 = local_940 != (SSL_SESSION *)0x0;
          pcVar58 = *(char **)((long)pCVar3->sockets + lVar44 + -0x80);
          pCVar4 = conn->data;
          iVar7 = do_file_type((char *)pSVar34);
          unaff_R12 = pSVar19;
          if (iVar7 == 0x2a || bVar61) {
            if (pcVar58 != (char *)0x0) {
              SSL_CTX_set_default_passwd_cb_userdata(pSVar19,pcVar58);
              SSL_CTX_set_default_passwd_cb(pSVar19,passwd_callback);
            }
            if (iVar7 < 0x2a) {
              if (iVar7 == 1) {
                iVar7 = SSL_CTX_use_certificate_chain_file(pSVar19,(char *)local_940);
                if (iVar7 != 1) {
                  uVar16 = ERR_get_error();
                  ERR_error_string_n(uVar16,(char *)local_838,0x100);
                  pcVar58 = 
                  "could not load PEM client certificate, OpenSSL error %s, (no key found, wrong pass phrase, or wrong file format?)"
                  ;
                  goto LAB_0051288f;
                }
LAB_005126bb:
                unaff_R12 = (SSL_CTX *)0x0;
LAB_005132a0:
                iVar7 = do_file_type((char *)pSVar38);
                if (iVar7 < 0x2a) {
                  pSVar45 = local_8d0;
                  if (iVar7 == 1) {
                    if ((int)unaff_R12 == 0) {
                      if (local_8d0 == (SSL_SESSION *)0x0) {
                        pSVar45 = local_940;
                      }
                      goto LAB_0051330c;
                    }
                  }
                  else {
                    if (iVar7 != 2) {
LAB_005132e5:
                      pcVar58 = "not supported file type for private key";
                      pSVar19 = unaff_R12;
                      goto LAB_005134ad;
                    }
LAB_0051330c:
                    iVar7 = SSL_CTX_use_PrivateKey_file(pSVar19,(char *)pSVar45,iVar7);
                    if (iVar7 != 1) {
                      pSVar34 = (SSL_SESSION *)"PEM";
                      if (pSVar38 != (SSL_SESSION *)0x0) {
                        pSVar34 = pSVar38;
                      }
                      pcVar58 = "unable to set private key file: \'%s\' type %s";
                      pSVar19 = unaff_R12;
                      goto LAB_0051349a;
                    }
                  }
LAB_00513327:
                  pSVar40 = SSL_new(pSVar19);
                  if (pSVar40 == (SSL *)0x0) {
                    pcVar58 = "unable to create an SSL structure";
                    pSVar19 = unaff_R12;
                  }
                  else {
                    local_8b8 = (SSL_SESSION *)SSL_get_certificate(pSVar40);
                    if (local_8b8 != (SSL_SESSION *)0x0) {
                      pEVar30 = X509_get_pubkey((X509 *)local_8b8);
                      from = SSL_get_privatekey(pSVar40);
                      EVP_PKEY_copy_parameters(pEVar30,from);
                      EVP_PKEY_free(pEVar30);
                    }
                    SSL_free(pSVar40);
                    iVar47 = SSL_CTX_check_private_key(pSVar19);
                    iVar7 = 0;
                    if (iVar47 != 0) goto LAB_005134ba;
                    pcVar58 = "Private key does not match the certificate public key";
                    pSVar19 = unaff_R12;
                  }
                }
                else if (iVar7 == 0x2a) {
                  if ((pCVar4->state).engine == (ENGINE *)0x0) {
                    pcVar58 = "crypto engine not set, can\'t load private key";
                    pSVar19 = unaff_R12;
                  }
                  else {
                    method = UI_create_method("curl user interface");
                    if (method == (UI_METHOD *)0x0) {
                      pcVar58 = "unable do create OpenSSL user-interface method";
                      pSVar19 = unaff_R12;
                    }
                    else {
                      pUVar39 = UI_OpenSSL();
                      iVar7 = UI_method_get_opener((UI *)pUVar39);
                      UI_method_set_opener(method,(opener *)CONCAT44(extraout_var,iVar7));
                      pUVar39 = UI_OpenSSL();
                      iVar7 = UI_method_get_closer((UI *)pUVar39);
                      UI_method_set_closer(method,(closer *)CONCAT44(extraout_var_00,iVar7));
                      UI_method_set_reader(method,ssl_ui_reader);
                      UI_method_set_writer(method,ssl_ui_writer);
                      pEVar30 = ENGINE_load_private_key
                                          ((ENGINE *)(pCVar4->state).engine,(char *)local_8d0,method
                                           ,pcVar58);
                      UI_destroy_method(method);
                      if (pEVar30 != (EVP_PKEY *)0x0) {
                        iVar7 = SSL_CTX_use_PrivateKey(pSVar19,pEVar30);
                        if (iVar7 == 1) {
                          EVP_PKEY_free(pEVar30);
                          goto LAB_00513327;
                        }
                        Curl_failf(pCVar4,"unable to set private key");
                        EVP_PKEY_free(pEVar30);
                        goto LAB_005134b4;
                      }
                      pcVar58 = "failed to load private key from crypto engine";
                      pSVar19 = unaff_R12;
                    }
                  }
                }
                else {
                  if (iVar7 != 0x2b) goto LAB_005132e5;
                  if ((int)unaff_R12 != 0) goto LAB_00513327;
                  pcVar58 = "file type P12 for private key not supported";
                  pSVar19 = unaff_R12;
                }
LAB_005134ad:
                Curl_failf(pCVar4,pcVar58);
                unaff_R12 = pSVar19;
              }
              else {
                if (iVar7 == 2) {
                  iVar7 = SSL_CTX_use_certificate_file(pSVar19,(char *)local_940,2);
                  if (iVar7 == 1) goto LAB_005126bb;
                  uVar16 = ERR_get_error();
                  ERR_error_string_n(uVar16,(char *)local_838,0x100);
                  pcVar58 = 
                  "could not load ASN1 client certificate, OpenSSL error %s, (no key found, wrong pass phrase, or wrong file format?)"
                  ;
LAB_0051288f:
                  pSVar34 = local_838;
                }
                else {
LAB_00512694:
                  pcVar58 = "not supported file type \'%s\' for certificate";
                }
                Curl_failf(pCVar4,pcVar58,pSVar34);
              }
LAB_005134b4:
              iVar7 = 1;
            }
            else {
              if (iVar7 == 0x2a) {
                e = (ENGINE *)(pCVar4->state).engine;
                if (e == (ENGINE *)0x0) {
                  pcVar58 = "crypto engine not set, can\'t load certificate";
                }
                else {
                  local_8b8 = local_940;
                  local_8b0 = (X509 *)0x0;
                  iVar7 = ENGINE_ctrl(e,0xd,0,"LOAD_CERT_CTRL",(f *)0x0);
                  if (iVar7 != 0) {
                    iVar7 = ENGINE_ctrl_cmd((ENGINE *)(pCVar4->state).engine,"LOAD_CERT_CTRL",0,
                                            &local_8b8,(f *)0x0,1);
                    if (iVar7 != 0) {
                      if (local_8b0 == (X509 *)0x0) {
                        pcVar58 = "ssl engine didn\'t initialized the certificate properly.";
                        goto LAB_005134ad;
                      }
                      iVar7 = SSL_CTX_use_certificate(pSVar19,local_8b0);
                      if (iVar7 == 1) {
                        X509_free(local_8b0);
                        unaff_R12 = (SSL_CTX *)0x0;
                        goto LAB_005132a0;
                      }
                      Curl_failf(pCVar4,"unable to set client certificate");
                      X509_free(local_8b0);
                      goto LAB_005134b4;
                    }
                    uVar16 = ERR_get_error();
                    pSVar34 = local_838;
                    ERR_error_string_n(uVar16,(char *)pSVar34,0x100);
                    pcVar58 = "ssl engine cannot load client cert with id \'%s\' [%s]";
                    pSVar45 = local_940;
LAB_0051349a:
                    Curl_failf(pCVar4,pcVar58,pSVar45,pSVar34);
                    unaff_R12 = pSVar19;
                    goto LAB_005134b4;
                  }
                  pcVar58 = "ssl engine does not support loading certificates";
                }
                goto LAB_005134ad;
              }
              if (iVar7 != 0x2b) goto LAB_00512694;
              local_948 = (ASN1_GENERALIZEDTIME *)0x0;
              pFVar35 = fopen64((char *)local_940,"rb");
              if (pFVar35 == (FILE *)0x0) {
                pcVar18 = "could not open PKCS12 file \'%s\'";
LAB_00512eed:
                Curl_failf(pCVar4,pcVar18,local_940);
LAB_00512f01:
                unaff_R12 = (SSL_CTX *)0x0;
                iVar7 = 1;
              }
              else {
                p12 = d2i_PKCS12_fp(pFVar35,(PKCS12 **)0x0);
                fclose(pFVar35);
                if (p12 == (PKCS12 *)0x0) {
                  pcVar18 = "error reading PKCS12 file \'%s\'";
                  goto LAB_00512eed;
                }
                PKCS12_PBE_add();
                iVar7 = PKCS12_parse(p12,pcVar58,&local_938,(X509 **)&local_8b8,
                                     (stack_st_X509 **)&local_948);
                if (iVar7 == 0) {
                  uVar16 = ERR_get_error();
                  ERR_error_string_n(uVar16,(char *)local_838,0x100);
                  Curl_failf(pCVar4,"could not parse PKCS12 file, check password, OpenSSL error %s",
                             local_838);
                  PKCS12_free(p12);
                  goto LAB_00512f01;
                }
                PKCS12_free(p12);
                iVar7 = SSL_CTX_use_certificate(pSVar19,(X509 *)local_8b8);
                if (iVar7 == 1) {
                  iVar7 = SSL_CTX_use_PrivateKey(pSVar19,local_938);
                  if (iVar7 != 1) {
                    pcVar18 = "unable to use private key from PKCS12 file \'%s\'";
                    pSVar34 = local_940;
                    goto LAB_0051324c;
                  }
                  iVar7 = SSL_CTX_check_private_key(pSVar19);
                  if (iVar7 == 0) {
                    pcVar18 = 
                    "private key from PKCS12 file \'%s\' does not match certificate in same file";
                    pSVar34 = local_940;
                    goto LAB_0051324c;
                  }
                  if (local_948 == (ASN1_GENERALIZEDTIME *)0x0) {
                    bVar61 = false;
                    goto LAB_00513256;
                  }
                  do {
                    iVar7 = OPENSSL_sk_num(local_948);
                    bVar61 = iVar7 != 0;
                    if (iVar7 == 0) goto LAB_00513256;
                    pXVar23 = (X509 *)OPENSSL_sk_pop(local_948);
                    iVar7 = SSL_CTX_add_client_CA(pSVar19,pXVar23);
                    pcVar18 = "cannot add certificate to client CA list";
                    if (iVar7 == 0) {
LAB_005125a8:
                      X509_free(pXVar23);
                      Curl_failf(pCVar4,pcVar18);
                      iVar7 = 3;
                    }
                    else {
                      iVar7 = 0;
                      lVar48 = SSL_CTX_ctrl(pSVar19,0xe,0,pXVar23);
                      pcVar18 = "cannot add certificate to certificate chain";
                      if (lVar48 == 0) goto LAB_005125a8;
                    }
                  } while (iVar7 == 0);
                  bVar61 = true;
                  if (iVar7 == 3) goto LAB_00513256;
                  unaff_R12 = (SSL_CTX *)0x0;
                }
                else {
                  uVar16 = ERR_get_error();
                  ERR_error_string_n(uVar16,(char *)local_838,0x100);
                  pcVar18 = "could not load PKCS12 client certificate, OpenSSL error %s";
                  pSVar34 = local_838;
LAB_0051324c:
                  Curl_failf(pCVar4,pcVar18,pSVar34);
                  bVar61 = true;
LAB_00513256:
                  EVP_PKEY_free(local_938);
                  X509_free((X509 *)local_8b8);
                  OPENSSL_sk_pop_free(local_948);
                  iVar7 = 2 - (uint)bVar61;
                  unaff_R12 = (SSL_CTX *)(ulong)(bVar61 ^ 1);
                }
              }
              if (iVar7 == 2) goto LAB_005132a0;
            }
LAB_005134ba:
            if (iVar7 != 0) {
              CVar9 = CURLE_SSL_CERTPROBLEM;
              goto LAB_00511052;
            }
          }
        }
        if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
           (lVar48 = 0x3c0, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete))
        {
          lVar48 = 0x370;
        }
        pcVar58 = *(char **)((conn->chunk).hexbuffer + lVar48 + -0x20);
        pcVar18 = "ALL:!EXPORT:!EXPORT40:!EXPORT56:!aNULL:!LOW:!RC4:@STRENGTH";
        if (pcVar58 != (char *)0x0) {
          pcVar18 = pcVar58;
        }
        iVar7 = SSL_CTX_set_cipher_list((SSL_CTX *)conn->ssl[lVar13].ctx,pcVar18);
        if (iVar7 == 0) {
          Curl_failf(pCVar3,"failed setting cipher list: %s",pcVar18);
          CVar9 = CURLE_SSL_CIPHER;
        }
        else {
          Curl_infof(pCVar3,"Cipher selection: %s\n",pcVar18);
          uVar26 = local_8f8;
          iVar7 = (int)local_8f8;
          if (local_928 != (char *)0x0 || local_908 != (SSL_CTX *)0x0) {
            iVar47 = SSL_CTX_load_verify_locations
                               ((SSL_CTX *)conn->ssl[lVar13].ctx,local_928,(char *)local_908);
            if ((iVar47 == 0) && ((char)uVar26 != '\0')) {
              pcVar58 = local_928;
              if (local_928 == (char *)0x0) {
                pcVar58 = "none";
              }
              pSVar19 = (SSL_CTX *)0x595622;
              if (local_908 != (SSL_CTX *)0x0) {
                pSVar19 = local_908;
              }
              Curl_failf(pCVar3,
                         "error setting certificate verify locations:\n  CAfile: %s\n  CApath: %s",
                         pcVar58,pSVar19);
              CVar9 = CURLE_SSL_CACERT_BADFILE;
              goto LAB_00511052;
            }
            pcVar58 = "error setting certificate verify locations, continuing anyway:\n";
            if (iVar47 != 0) {
              pcVar58 = "successfully set certificate verify locations:\n";
            }
            Curl_infof(pCVar3,pcVar58);
            pcVar58 = local_928;
            if (local_928 == (char *)0x0) {
              pcVar58 = "none";
            }
            Curl_infof(pCVar3,"  CAfile: %s\n  CApath: %s\n",pcVar58);
          }
          if (local_8e0 != (X509 *)0x0) {
            pXVar36 = SSL_CTX_get_cert_store((SSL_CTX *)conn->ssl[lVar13].ctx);
            m = X509_LOOKUP_file();
            ctx = X509_STORE_add_lookup(pXVar36,m);
            pXVar23 = local_8e0;
            if ((ctx == (X509_LOOKUP *)0x0) ||
               (iVar7 = X509_load_crl_file(ctx,(char *)local_8e0,1), iVar7 == 0)) {
              Curl_failf(pCVar3,"error loading CRL file: %s",pXVar23);
              CVar9 = CURLE_SSL_CRL_BADFILE;
              goto LAB_00511052;
            }
            Curl_infof(pCVar3,"successfully load CRL file:\n");
            pXVar36 = SSL_CTX_get_cert_store((SSL_CTX *)conn->ssl[lVar13].ctx);
            X509_STORE_set_flags(pXVar36,0xc);
            Curl_infof(pCVar3,"  CRLfile: %s\n",pXVar23);
            iVar7 = (int)local_8f8;
          }
          SSL_CTX_set_verify((SSL_CTX *)conn->ssl[lVar13].ctx,iVar7,(callback *)0x0);
          p_Var5 = (pCVar3->set).ssl.fsslctx;
          if ((p_Var5 == (curl_ssl_ctx_callback)0x0) ||
             (CVar9 = (*p_Var5)(pCVar3,conn->ssl[lVar13].ctx,(pCVar3->set).ssl.fsslctxp),
             CVar9 == CURLE_OK)) {
            pSVar40 = (SSL *)conn->ssl[lVar13].handle;
            if (pSVar40 != (SSL *)0x0) {
              SSL_free(pSVar40);
            }
            pSVar40 = SSL_new((SSL_CTX *)conn->ssl[lVar13].ctx);
            pCVar4 = local_900;
            conn->ssl[lVar13].handle = (SSL *)pSVar40;
            if (pSVar40 == (SSL *)0x0) {
              Curl_failf(pCVar3,"SSL: couldn\'t create a context (handle)!");
              goto LAB_00511344;
            }
            if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
               (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
              if ((conn->proxy_ssl_config).verifystatus != false) {
LAB_00513767:
                SSL_ctrl(pSVar40,0x41,1,(void *)0x0);
              }
            }
            else if ((conn->ssl_config).verifystatus == true) goto LAB_00513767;
            SSL_set_connect_state((SSL *)conn->ssl[lVar13].handle);
            conn->ssl[lVar13].server_cert = (X509 *)0x0;
            iVar7 = inet_pton(2,(char *)pCVar4,&local_938);
            if ((iVar7 == 0) &&
               (lVar48 = SSL_ctrl((SSL *)conn->ssl[lVar13].handle,0x37,0,pCVar4), lVar48 == 0)) {
              Curl_infof(pCVar3,
                         "WARNING: failed to configure server name indication (SNI) TLS extension\n"
                        );
            }
            if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
               (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
              if ((pCVar3->set).proxy_ssl.primary.sessionid == false) goto LAB_0051389d;
LAB_00513837:
              local_8b8 = (SSL_SESSION *)0x0;
              Curl_ssl_sessionid_lock(conn);
              _Var6 = Curl_ssl_getsessionid(conn,&local_8b8,(size_t *)0x0,(int)local_918);
              if (_Var6) {
LAB_00513895:
                Curl_ssl_sessionid_unlock(conn);
                goto LAB_0051389d;
              }
              iVar7 = SSL_set_session((SSL *)conn->ssl[lVar13].handle,local_8b8);
              if (iVar7 != 0) {
                Curl_infof(pCVar3,"SSL re-using session ID\n");
                goto LAB_00513895;
              }
              Curl_ssl_sessionid_unlock(conn);
              uVar16 = ERR_get_error();
              ERR_error_string_n(uVar16,(char *)local_838,0x100);
              pcVar58 = "SSL: SSL_set_session failed: %s";
LAB_00513965:
              Curl_failf(pCVar3,pcVar58,local_838);
              goto LAB_00511426;
            }
            if ((pCVar3->set).ssl.primary.sessionid == true) goto LAB_00513837;
LAB_0051389d:
            lVar48 = local_8d8;
            if ((&conn->proxy_ssl[0].use)[local_8d8 * 8] == true) {
              pBVar20 = BIO_f_ssl();
              pBVar22 = BIO_new(pBVar20);
              BIO_ctrl(pBVar22,0x6d,0,(&conn->proxy_ssl[0].handle)[lVar48]);
              SSL_set_bio((SSL *)conn->ssl[lVar13].handle,pBVar22,pBVar22);
            }
            else {
              iVar7 = SSL_set_fd((SSL *)conn->ssl[lVar13].handle,(int)local_920);
              if (iVar7 == 0) {
                uVar16 = ERR_get_error();
                ERR_error_string_n(uVar16,(char *)local_838,0x100);
                pcVar58 = "SSL: SSL_set_fd failed: %s";
                goto LAB_00513965;
              }
            }
            conn->ssl[lVar13].connecting_state = ssl_connect_2;
            CVar9 = CURLE_OK;
          }
          else {
            Curl_failf(pCVar3,"error signaled by ssl ctx callback");
          }
        }
      }
    }
    else {
switchD_005111f3_default:
      Curl_failf(pCVar3,"Unrecognized parameter passed via CURLOPT_SSLVERSION");
LAB_00511426:
      CVar9 = CURLE_SSL_CONNECT_ERROR;
    }
LAB_00511052:
    if (CVar9 != CURLE_OK) {
      return CVar9;
    }
  }
  local_940 = (SSL_SESSION *)&(conn->http_proxy).host.name;
  while (sVar1 = conn->ssl[lVar13].connecting_state, sVar1 - ssl_connect_2 < 3) {
    tVar14 = Curl_timeleft(pCVar59,(timeval *)0x0,true);
    if (tVar14 < 0) goto LAB_0051106d;
    sVar1 = conn->ssl[lVar13].connecting_state;
    if ((sVar1 & ~ssl_connect_2) == ssl_connect_2_reading) {
      writefd = -1;
      if (sVar1 == ssl_connect_2_writing) {
        writefd = (curl_socket_t)local_930;
      }
      readfd0 = -1;
      if (sVar1 == ssl_connect_2_reading) {
        readfd0 = (curl_socket_t)local_930;
      }
      if (nonblocking) {
        tVar14 = 0;
      }
      iVar7 = Curl_socket_check(readfd0,-1,writefd,tVar14);
      if (iVar7 < 0) {
        puVar15 = (uint *)__errno_location();
        bVar61 = false;
        Curl_failf(pCVar59,"select/poll on SSL socket, errno: %d",(ulong)*puVar15);
        unaff_R12 = (SSL_CTX *)0x23;
      }
      else {
        bVar61 = true;
        if (iVar7 == 0) {
          if (nonblocking) {
            *local_8c0 = false;
            bVar61 = false;
            unaff_R12 = (SSL_CTX *)0x0;
          }
          else {
            bVar61 = false;
            Curl_failf(pCVar59,"SSL connection timeout");
            unaff_R12 = (SSL_CTX *)0x1c;
          }
        }
      }
      if (!bVar61) {
        return (CURLcode)unaff_R12;
      }
    }
    if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
       (lVar48 = 0x518, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      lVar48 = 0x468;
    }
    pCVar3 = conn->data;
    ERR_clear_error();
    iVar7 = SSL_connect((SSL *)conn->ssl[lVar13].handle);
    if (iVar7 == 1) {
      conn->ssl[lVar13].connecting_state = ssl_connect_3;
      pSVar40 = (SSL *)conn->ssl[lVar13].handle;
      pcVar58 = "";
      if (pSVar40 != (SSL *)0x0) {
        iVar7 = SSL_version(pSVar40);
        pcVar58 = "TLSv1.3";
        switch(iVar7) {
        case 0x300:
          pcVar58 = "SSLv3";
          break;
        case 0x301:
          pcVar58 = "TLSv1.0";
          break;
        case 0x302:
          pcVar58 = "TLSv1.1";
          break;
        case 0x303:
          pcVar58 = "TLSv1.2";
          break;
        case 0x304:
          break;
        default:
          if (iVar7 == 2) {
            pcVar58 = "SSLv2";
          }
          else {
            pcVar58 = "unknown";
          }
        }
      }
      c = SSL_get_current_cipher((SSL *)conn->ssl[lVar13].handle);
      pcVar18 = SSL_CIPHER_get_name(c);
      CVar46 = CURLE_OK;
      CVar9 = CURLE_OK;
      Curl_infof(pCVar3,"SSL connection using %s / %s\n",pcVar58,pcVar18);
      if ((conn->bits).tls_enable_alpn == true) {
        SSL_get0_alpn_selected(conn->ssl[lVar13].handle,local_838,&local_8b8);
        if ((int)local_8b8 == 0) {
          Curl_infof(pCVar3,"ALPN, server did not agree to a protocol\n");
        }
        else {
          Curl_infof(pCVar3,"ALPN, server accepted to use %.*s\n",(ulong)local_8b8 & 0xffffffff,
                     CONCAT71(local_838[0]._1_7_,(undefined1)local_838[0].ssl_version));
          CVar9 = CVar46;
          if (((int)local_8b8 == 8) &&
             (*(long *)CONCAT71(local_838[0]._1_7_,(undefined1)local_838[0].ssl_version) ==
              0x312e312f70747468)) {
            conn->negnpn = 2;
          }
        }
      }
    }
    else {
      uVar8 = SSL_get_error((SSL *)conn->ssl[lVar13].handle,iVar7);
      if (uVar8 == 3) {
        conn->ssl[lVar13].connecting_state = ssl_connect_2_writing;
      }
      else {
        if (uVar8 != 2) {
          memset(local_838,0,0x100);
          conn->ssl[lVar13].connecting_state = ssl_connect_2;
          uVar16 = ERR_get_error();
          uVar12 = (uint)uVar16;
          if ((((int)uVar12 < 0) || ((uVar12 & 0xff800000) != 0xa000000)) ||
             ((uVar12 & 0x7fffff) != 0x86)) {
            ERR_error_string_n(uVar16,(char *)local_838,0x100);
            CVar9 = CURLE_SSL_CONNECT_ERROR;
          }
          else {
            lVar17 = SSL_get_verify_result((SSL *)conn->ssl[lVar13].handle);
            if (lVar17 == 0) {
              local_838[0]._16_8_ = 0x6163696669726576;
              builtin_memcpy(&local_838[0].ssl_version,"tion failed",0xc);
              local_838[0].ssl_version._0_1_ = 0x53;
              local_838[0]._1_7_ = 0x74726563204c53;
              builtin_memcpy(&local_838[0].ssl_version,"ificate ",8);
            }
            else {
              *(long *)((long)pCVar3->sockets + lVar48 + -0x80) = lVar17;
              pcVar58 = X509_verify_cert_error_string(lVar17);
              curl_msnprintf((char *)local_838,0x100,"SSL certificate problem: %s",pcVar58);
            }
            CVar9 = CURLE_SSL_CACERT;
          }
          if (uVar16 == 0) {
            cVar2 = (conn->http_proxy).proxytype;
            if ((cVar2 != CURLPROXY_HTTPS) ||
               (pSVar34 = local_940,
               conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
              pSVar34 = (SSL_SESSION *)&(conn->host).name;
            }
            if ((cVar2 == CURLPROXY_HTTPS) &&
               (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
              lVar48 = conn->port;
            }
            else {
              lVar48 = (long)conn->remote_port;
            }
            pcVar58 = "SSL_ERROR unknown";
            if (uVar8 < 0xb) {
              pcVar58 = (&PTR_anon_var_dwarf_13405b4_00676788)[uVar8];
            }
            Curl_failf(pCVar3,"OpenSSL SSL_connect: %s in connection to %s:%ld ",pcVar58,
                       *(char **)pSVar34,lVar48);
          }
          else {
            Curl_failf(pCVar3,"%s",local_838);
          }
          goto LAB_00510e05;
        }
        conn->ssl[lVar13].connecting_state = ssl_connect_2_reading;
      }
      CVar9 = CURLE_OK;
    }
LAB_00510e05:
    if (CVar9 != CURLE_OK) {
      return CVar9;
    }
    if ((nonblocking) && (conn->ssl[lVar13].connecting_state - ssl_connect_2 < 3)) {
      return CURLE_OK;
    }
  }
  if (sVar1 != ssl_connect_3) goto LAB_005130e3;
  pCVar59 = conn->data;
  if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
     (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
    if ((pCVar59->set).proxy_ssl.primary.sessionid == false) goto LAB_0051147a;
LAB_00511372:
    local_838[0].ssl_version._0_1_ = 0;
    local_838[0]._1_7_ = 0;
    pSVar34 = SSL_get1_session((SSL *)conn->ssl[lVar13].handle);
    Curl_ssl_sessionid_lock(conn);
    _Var6 = Curl_ssl_getsessionid(conn,(void **)local_838,(size_t *)0x0,(int)local_918);
    if ((_Var6) ||
       ((SSL_SESSION *)CONCAT71(local_838[0]._1_7_,(undefined1)local_838[0].ssl_version) == pSVar34)
       ) {
      if (_Var6) goto LAB_005113e1;
      SSL_SESSION_free(pSVar34);
LAB_00511466:
      Curl_ssl_sessionid_unlock(conn);
      bVar61 = true;
    }
    else {
      Curl_infof(pCVar59,"old SSL session ID is stale, removing\n");
      Curl_ssl_delsessionid
                (conn,(void *)CONCAT71(local_838[0]._1_7_,(undefined1)local_838[0].ssl_version));
LAB_005113e1:
      CVar9 = Curl_ssl_addsessionid(conn,pSVar34,0,(int)local_918);
      if (CVar9 == CURLE_OK) goto LAB_00511466;
      pSVar34 = (SSL_SESSION *)(ulong)CVar9;
      Curl_ssl_sessionid_unlock(conn);
      bVar61 = false;
      Curl_failf(pCVar59,"failed to store ssl session");
    }
    CVar9 = (CURLcode)pSVar34;
    if (bVar61) goto LAB_0051147a;
  }
  else {
    if ((pCVar59->set).ssl.primary.sessionid == true) goto LAB_00511372;
LAB_0051147a:
    cVar2 = (conn->http_proxy).proxytype;
    if ((cVar2 == CURLPROXY_HTTPS) &&
       (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
      cVar50 = (conn->proxy_ssl_config).verifypeer;
    }
    else {
      cVar50 = (conn->ssl_config).verifypeer;
    }
    cVar41 = '\x01';
    if (cVar50 == '\0') {
      if ((cVar2 != CURLPROXY_HTTPS) ||
         (lVar48 = 0x391, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
        lVar48 = 0x341;
      }
      cVar41 = (conn->chunk).hexbuffer[lVar48 + -0x20];
    }
    local_928 = (char *)CONCAT71(local_928._1_7_,cVar41);
    pCVar59 = conn->data;
    if ((cVar2 != CURLPROXY_HTTPS) ||
       (local_8d8 = 0x518, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
      local_8d8 = 0x468;
    }
    pBVar20 = BIO_s_mem();
    local_940 = (SSL_SESSION *)BIO_new(pBVar20);
    if ((pCVar59->set).ssl.certinfo == true) {
      pCVar3 = conn->data;
      psVar21 = SSL_get_peer_cert_chain((SSL *)conn->ssl[lVar13].handle);
      if (psVar21 != (stack_st_X509 *)0x0) {
        local_918 = psVar21;
        iVar7 = OPENSSL_sk_num(psVar21);
        CVar9 = Curl_ssl_init_certinfo(pCVar3,iVar7);
        if (CVar9 == CURLE_OK) {
          local_900 = pCVar59;
          pBVar20 = BIO_s_mem();
          pBVar22 = BIO_new(pBVar20);
          if (0 < iVar7) {
            iVar47 = 0;
            do {
              pXVar23 = (X509 *)OPENSSL_sk_value(local_918,iVar47);
              local_8f0 = (ASN1_GENERALIZEDTIME *)0x0;
              pXVar24 = X509_get_subject_name(pXVar23);
              X509_NAME_print_ex(pBVar22,pXVar24,0,0x82031f);
              sVar25 = BIO_ctrl(pBVar22,3,0,&local_948);
              Curl_ssl_push_certinfo_len(pCVar3,iVar47,"Subject",(char *)local_948,sVar25);
              BIO_ctrl(pBVar22,1,0,(void *)0x0);
              pXVar24 = X509_get_issuer_name(pXVar23);
              X509_NAME_print_ex(pBVar22,pXVar24,0,0x82031f);
              sVar25 = BIO_ctrl(pBVar22,3,0,&local_948);
              Curl_ssl_push_certinfo_len(pCVar3,iVar47,"Issuer",(char *)local_948,sVar25);
              BIO_ctrl(pBVar22,1,0,(void *)0x0);
              uVar26 = X509_get_version(pXVar23);
              BIO_printf(pBVar22,"%lx",uVar26);
              sVar25 = BIO_ctrl(pBVar22,3,0,&local_948);
              Curl_ssl_push_certinfo_len(pCVar3,iVar47,"Version",(char *)local_948,sVar25);
              BIO_ctrl(pBVar22,1,0,(void *)0x0);
              local_930 = pXVar23;
              pAVar27 = X509_get_serialNumber(pXVar23);
              if (pAVar27->type == 0x102) {
                BIO_puts(pBVar22,"-");
              }
              if (0 < pAVar27->length) {
                lVar48 = 0;
                do {
                  BIO_printf(pBVar22,"%02x",(ulong)pAVar27->data[lVar48]);
                  lVar48 = lVar48 + 1;
                } while (lVar48 < pAVar27->length);
              }
              sVar25 = BIO_ctrl(pBVar22,3,0,&local_948);
              Curl_ssl_push_certinfo_len(pCVar3,iVar47,"Serial Number",(char *)local_948,sVar25);
              BIO_ctrl(pBVar22,1,0,(void *)0x0);
              local_910 = (SSL_SESSION *)0x0;
              pAVar28 = ASN1_STRING_new();
              if (pAVar28 != (ASN1_STRING *)0x0) {
                X509_get0_signature(&local_8f0,&local_910,local_930);
                X509_signature_print(pBVar22,(X509_ALGOR *)local_910,pAVar28);
                ASN1_STRING_free(pAVar28);
                if (local_910 != (SSL_SESSION *)0x0) {
                  i2a_ASN1_OBJECT(pBVar22,*(ASN1_OBJECT **)local_910);
                  sVar25 = BIO_ctrl(pBVar22,3,0,&local_948);
                  Curl_ssl_push_certinfo_len
                            (pCVar3,iVar47,"Public Key Algorithm",(char *)local_948,sVar25);
                  BIO_ctrl(pBVar22,1,0,(void *)0x0);
                }
              }
              uVar26 = X509_get0_extensions(local_930);
              iVar10 = OPENSSL_sk_num(uVar26);
              if ((0 < iVar10) && (iVar10 = OPENSSL_sk_num(uVar26), 0 < iVar10)) {
                iVar10 = 0;
                do {
                  ex = (X509_EXTENSION *)OPENSSL_sk_value(uVar26,iVar10);
                  pBVar20 = BIO_s_mem();
                  out = BIO_new(pBVar20);
                  if (out == (BIO *)0x0) break;
                  a = X509_EXTENSION_get_object(ex);
                  i2t_ASN1_OBJECT((char *)&local_8b8,0x80,a);
                  iVar11 = X509V3_EXT_print(out,ex,0,0);
                  if (iVar11 == 0) {
                    v = X509_EXTENSION_get_data(ex);
                    ASN1_STRING_print(out,v);
                  }
                  BIO_ctrl(out,0x73,0,&local_938);
                  uVar16._0_4_ = local_938->type;
                  uVar16._4_4_ = local_938->save_type;
                  if (uVar16 != 0) {
                    pSVar34 = local_838;
                    uVar55 = 0;
                    do {
                      lVar48 = *(long *)&local_938->references;
                      bVar61 = *(char *)(lVar48 + uVar55) == '\n';
                      pcVar58 = "";
                      if (bVar61) {
                        pcVar58 = ", ";
                      }
                      uVar55 = bVar61 + uVar55;
                      if (uVar55 < uVar16) {
                        cVar50 = *(char *)(lVar48 + uVar55);
                        uVar56 = uVar55;
                        while (cVar50 == ' ') {
                          uVar55 = uVar16;
                          if (uVar16 <= uVar56 + 1) goto LAB_00511962;
                          cVar50 = *(char *)(lVar48 + 1 + uVar56);
                          uVar56 = uVar56 + 1;
                        }
                        iVar11 = curl_msnprintf((char *)pSVar34,
                                                (long)local_838 + (0x200 - (long)pSVar34),"%s%c",
                                                pcVar58,(ulong)(uint)(int)cVar50);
                        pSVar34 = (SSL_SESSION *)(pSVar34->key_arg + (long)iVar11 + -8);
                        uVar55 = uVar56;
                      }
LAB_00511962:
                      uVar55 = uVar55 + 1;
                      uVar16._0_4_ = local_938->type;
                      uVar16._4_4_ = local_938->save_type;
                    } while (uVar55 < uVar16);
                  }
                  Curl_ssl_push_certinfo(pCVar3,iVar47,(char *)&local_8b8,(char *)local_838);
                  BIO_free(out);
                  iVar10 = iVar10 + 1;
                  iVar11 = OPENSSL_sk_num(uVar26);
                } while (iVar10 < iVar11);
              }
              pXVar23 = local_930;
              pAVar29 = (ASN1_TIME *)X509_get0_notBefore(local_930);
              ASN1_TIME_print(pBVar22,pAVar29);
              sVar25 = BIO_ctrl(pBVar22,3,0,&local_948);
              Curl_ssl_push_certinfo_len(pCVar3,iVar47,"Start date",(char *)local_948,sVar25);
              BIO_ctrl(pBVar22,1,0,(void *)0x0);
              pAVar29 = (ASN1_TIME *)X509_get0_notAfter(pXVar23);
              ASN1_TIME_print(pBVar22,pAVar29);
              sVar25 = BIO_ctrl(pBVar22,3,0,&local_948);
              Curl_ssl_push_certinfo_len(pCVar3,iVar47,"Expire date",(char *)local_948,sVar25);
              BIO_ctrl(pBVar22,1,0,(void *)0x0);
              pEVar30 = X509_get_pubkey(pXVar23);
              if (pEVar30 == (EVP_PKEY *)0x0) {
                Curl_infof(pCVar3,"   Unable to load public key\n");
              }
              else {
                iVar10 = EVP_PKEY_get_id(pEVar30);
                if (iVar10 == 0x74) {
                  uVar26 = EVP_PKEY_get0_DSA(pEVar30);
                  DSA_get0_pqg(uVar26,local_838,&local_8b8,&local_938);
                  DSA_get0_key(uVar26,&local_910,0);
                  bn = (BIGNUM *)CONCAT71(local_838[0]._1_7_,(undefined1)local_838[0].ssl_version);
                  pcVar58 = "dsa";
LAB_00511c39:
                  pubkey_show(pCVar3,(BIO *)pBVar22,iVar47,pcVar58,"p",bn);
                  pubkey_show(pCVar3,(BIO *)pBVar22,iVar47,pcVar58,"q",(BIGNUM *)local_8b8);
                  pubkey_show(pCVar3,(BIO *)pBVar22,iVar47,pcVar58,"g",(BIGNUM *)local_938);
                  pcVar18 = "pub_key";
                  pSVar34 = local_910;
LAB_00511ca2:
                  pubkey_show(pCVar3,(BIO *)pBVar22,iVar47,pcVar58,pcVar18,(BIGNUM *)pSVar34);
                }
                else {
                  if (iVar10 == 0x1c) {
                    uVar26 = EVP_PKEY_get0_DH(pEVar30);
                    DH_get0_pqg(uVar26,local_838,&local_8b8,&local_938);
                    DH_get0_key(uVar26,&local_910,0);
                    bn = (BIGNUM *)CONCAT71(local_838[0]._1_7_,(undefined1)local_838[0].ssl_version)
                    ;
                    pcVar58 = "dh";
                    goto LAB_00511c39;
                  }
                  if (iVar10 == 6) {
                    uVar26 = EVP_PKEY_get0_RSA(pEVar30);
                    RSA_get0_key(uVar26,local_838,&local_8b8,0);
                    BN_print(pBVar22,(BIGNUM *)
                                     CONCAT71(local_838[0]._1_7_,
                                              (undefined1)local_838[0].ssl_version));
                    sVar25 = BIO_ctrl(pBVar22,3,0,&local_948);
                    Curl_ssl_push_certinfo_len
                              (pCVar3,iVar47,"RSA Public Key",(char *)local_948,sVar25);
                    BIO_ctrl(pBVar22,1,0,(void *)0x0);
                    pubkey_show(pCVar3,(BIO *)pBVar22,iVar47,"rsa","n",
                                (BIGNUM *)
                                CONCAT71(local_838[0]._1_7_,(undefined1)local_838[0].ssl_version));
                    pcVar58 = "rsa";
                    pcVar18 = "e";
                    pSVar34 = local_8b8;
                    goto LAB_00511ca2;
                  }
                }
                EVP_PKEY_free(pEVar30);
              }
              if (local_8f0 != (ASN1_GENERALIZEDTIME *)0x0) {
                if (0 < local_8f0->length) {
                  lVar48 = 0;
                  do {
                    BIO_printf(pBVar22,"%02x:",(ulong)local_8f0->data[lVar48]);
                    lVar48 = lVar48 + 1;
                  } while (lVar48 < local_8f0->length);
                }
                sVar25 = BIO_ctrl(pBVar22,3,0,&local_948);
                Curl_ssl_push_certinfo_len(pCVar3,iVar47,"Signature",(char *)local_948,sVar25);
                BIO_ctrl(pBVar22,1,0,(void *)0x0);
              }
              PEM_write_bio_X509(pBVar22,local_930);
              sVar25 = BIO_ctrl(pBVar22,3,0,&local_948);
              Curl_ssl_push_certinfo_len(pCVar3,iVar47,"Cert",(char *)local_948,sVar25);
              BIO_ctrl(pBVar22,1,0,(void *)0x0);
              iVar47 = iVar47 + 1;
            } while (iVar47 != iVar7);
          }
          BIO_free(pBVar22);
          pCVar59 = local_900;
        }
      }
    }
    pXVar31 = (X509 *)SSL_get1_peer_certificate(conn->ssl[lVar13].handle);
    conn->ssl[lVar13].server_cert = pXVar31;
    if (pXVar31 == (X509 *)0x0) {
      BIO_free((BIO *)local_940);
      CVar9 = CURLE_OK;
      if ((char)local_928 != '\0') {
        Curl_failf(pCVar59,"SSL: couldn\'t get peer certificate!");
        CVar9 = CURLE_PEER_FAILED_VERIFICATION;
      }
    }
    else {
      if ((conn->http_proxy).proxytype == CURLPROXY_HTTPS) {
        pcVar58 = "Proxy";
        if (conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete) {
          pcVar58 = "Server";
        }
      }
      else {
        pcVar58 = "Server";
      }
      Curl_infof(pCVar59,"%s certificate:\n",pcVar58);
      pXVar24 = X509_get_subject_name((X509 *)conn->ssl[lVar13].server_cert);
      iVar7 = x509_name_oneline((X509_NAME *)pXVar24,(char *)local_838,size);
      pSVar34 = (SSL_SESSION *)"[NONE]";
      if (iVar7 == 0) {
        pSVar34 = local_838;
      }
      Curl_infof(pCVar59," subject: %s\n",pSVar34);
      pAVar29 = (ASN1_TIME *)X509_get0_notBefore(conn->ssl[lVar13].server_cert);
      pSVar34 = local_940;
      ASN1_TIME_print((BIO *)local_940,pAVar29);
      lVar48 = BIO_ctrl((BIO *)pSVar34,3,0,&local_910);
      Curl_infof(pCVar59," start date: %.*s\n",lVar48);
      BIO_ctrl((BIO *)pSVar34,1,0,(void *)0x0);
      pAVar29 = (ASN1_TIME *)X509_get0_notAfter(conn->ssl[lVar13].server_cert);
      ASN1_TIME_print((BIO *)pSVar34,pAVar29);
      lVar48 = BIO_ctrl((BIO *)pSVar34,3,0,&local_910);
      Curl_infof(pCVar59," expire date: %.*s\n",lVar48);
      BIO_ctrl((BIO *)pSVar34,1,0,(void *)0x0);
      BIO_free((BIO *)pSVar34);
      cVar2 = (conn->http_proxy).proxytype;
      if ((cVar2 == CURLPROXY_HTTPS) &&
         (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
        if ((conn->proxy_ssl_config).verifyhost == false) goto LAB_00512901;
LAB_00511f7c:
        if ((cVar2 != CURLPROXY_HTTPS) ||
           (lVar48 = 0x160, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete))
        {
          lVar48 = 0xd8;
        }
        pXVar23 = (X509 *)conn->ssl[lVar13].server_cert;
        local_940 = *(SSL_SESSION **)((conn->chunk).hexbuffer + lVar48 + -0x20);
        if ((cVar2 != CURLPROXY_HTTPS) ||
           (lVar48 = 0x168, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete))
        {
          lVar48 = 0xe0;
        }
        local_920 = conn->data;
        local_908 = *(SSL_CTX **)((conn->chunk).hexbuffer + lVar48 + -0x20);
        local_900 = pCVar59;
        iVar7 = inet_pton(2,(char *)local_940,&local_938);
        CVar9 = CURLE_OK;
        psVar21 = (stack_st_X509 *)0x0;
        local_8e0 = pXVar23;
        a_00 = (GENERAL_NAMES *)X509_get_ext_d2i(pXVar23,0x55,(int *)0x0,(int *)0x0);
        if (a_00 == (GENERAL_NAMES *)0x0) {
          pXVar23 = (X509 *)0x0;
          bVar57 = 0;
        }
        else {
          iVar47 = OPENSSL_sk_num(a_00);
          if (iVar47 < 1) {
            local_930 = (X509 *)0x0;
            bVar57 = 0;
          }
          else {
            iVar10 = 1;
            local_930 = (X509 *)0x0;
            local_918 = (stack_st_X509 *)0x0;
            local_8f8 = 0;
            bVar61 = false;
            do {
              piVar32 = (int *)OPENSSL_sk_value(a_00,iVar10 + -1);
              iVar11 = *piVar32;
              uVar43 = (undefined7)((ulong)psVar21 >> 8);
              if (iVar11 == 2) {
                psVar21 = (stack_st_X509 *)CONCAT71(uVar43,1);
                local_930 = (X509 *)psVar21;
              }
              else if (iVar11 == 7) {
                psVar21 = (stack_st_X509 *)CONCAT71(uVar43,1);
                local_918 = psVar21;
              }
              if (iVar11 == (uint)(iVar7 != 0) * 5 + 2) {
                __s = (stack_st_X509 *)ASN1_STRING_get0_data(*(undefined8 *)(piVar32 + 2));
                iVar11 = ASN1_STRING_length(*(ASN1_STRING **)(piVar32 + 2));
                sVar60 = (size_t)iVar11;
                if (iVar7 == 0) {
                  sVar33 = strlen((char *)__s);
                  if ((sVar33 == sVar60) &&
                     (iVar11 = Curl_cert_hostcheck((char *)__s,(char *)local_940), iVar11 != 0)) {
                    Curl_infof(local_920," subjectAltName: host \"%s\" matched cert\'s \"%s\"\n",
                               local_908);
                    bVar61 = true;
                    psVar21 = __s;
                  }
                }
                else if (((uint)(iVar7 != 0) * 4 == sVar60) &&
                        (iVar11 = bcmp(__s,&local_938,sVar60), iVar11 == 0)) {
                  Curl_infof(local_920," subjectAltName: host \"%s\" matched cert\'s IP address!\n",
                             local_908);
                  local_8f8 = CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
                }
              }
            } while ((iVar10 < iVar47) && (iVar10 = iVar10 + 1, !bVar61));
            local_930 = (X509 *)CONCAT71((int7)((ulong)local_930 >> 8),
                                         (byte)local_930 | (byte)local_918);
            bVar57 = bVar61 | (byte)local_8f8;
          }
          GENERAL_NAMES_free(a_00);
          pXVar23 = local_930;
        }
        pCVar59 = local_900;
        pSVar19 = local_908;
        pCVar3 = local_920;
        if ((bVar57 & 1) == 0) {
          if (((ulong)pXVar23 & 1) == 0) {
            local_8b8 = (SSL_SESSION *)0x57d84e;
            pXVar24 = X509_get_subject_name(local_8e0);
            if (pXVar24 == (X509_NAME *)0x0) {
              iVar7 = -1;
            }
            else {
              iVar47 = -1;
              do {
                iVar7 = iVar47;
                iVar47 = X509_NAME_get_index_by_NID(pXVar24,0xd,iVar7);
              } while (-1 < iVar47);
            }
            CVar9 = CURLE_OK;
            bVar61 = true;
            if (-1 < iVar7) {
              ne = X509_NAME_get_entry(pXVar24,iVar7);
              pAVar28 = X509_NAME_ENTRY_get_data(ne);
              if (pAVar28 != (ASN1_STRING *)0x0) {
                iVar7 = ASN1_STRING_type(pAVar28);
                if (iVar7 == 0xc) {
                  uVar8 = ASN1_STRING_length(pAVar28);
                  if ((-1 < (int)uVar8) &&
                     (pSVar34 = (SSL_SESSION *)
                                CRYPTO_malloc(uVar8 + 1,
                                              "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmcurl/lib/vtls/openssl.c"
                                              ,0x4f7), local_8b8 = pSVar34,
                     pSVar34 != (SSL_SESSION *)0x0)) {
                    __src = (void *)ASN1_STRING_get0_data(pAVar28);
                    memcpy(pSVar34,__src,(ulong)uVar8);
                    *(undefined1 *)((long)local_8b8->key_arg + ((ulong)uVar8 - 8)) = 0;
                  }
                }
                else {
                  uVar8 = ASN1_STRING_to_UTF8((uchar **)&local_8b8,pAVar28);
                }
                if (local_8b8 != (SSL_SESSION *)0x0) {
                  sVar60 = strlen((char *)local_8b8);
                  uVar12 = curlx_uztosi(sVar60);
                  if (uVar12 != uVar8) {
                    bVar61 = false;
                    Curl_failf(local_920,"SSL: illegal cert name field");
                    CVar9 = CURLE_PEER_FAILED_VERIFICATION;
                  }
                }
              }
            }
            pCVar59 = local_900;
            if (local_8b8 == (SSL_SESSION *)0x57d84e) {
              local_8b8 = (SSL_SESSION *)0x0;
            }
            if (bVar61) {
              if (local_8b8 == (SSL_SESSION *)0x0) {
                Curl_failf(local_920,"SSL: unable to obtain common name from peer certificate");
              }
              else {
                iVar7 = Curl_cert_hostcheck((char *)local_8b8,(char *)local_940);
                if (iVar7 != 0) {
                  CVar9 = CURLE_OK;
                  Curl_infof(local_920," common name: %s (matched)\n");
                  goto LAB_005128db;
                }
                Curl_failf(local_920,
                           "SSL: certificate subject name \'%s\' does not match target host name \'%s\'"
                           ,local_8b8);
              }
              CVar9 = CURLE_PEER_FAILED_VERIFICATION;
            }
LAB_005128db:
            if (local_8b8 != (SSL_SESSION *)0x0) {
              CRYPTO_free(local_8b8);
            }
          }
          else {
            Curl_infof(local_920," subjectAltName does not match %s\n",local_908);
            Curl_failf(pCVar3,
                       "SSL: no alternative certificate subject name matches target host name \'%s\'"
                       ,pSVar19);
            CVar9 = CURLE_PEER_FAILED_VERIFICATION;
          }
        }
        if (CVar9 == CURLE_OK) goto LAB_00512901;
LAB_00512f4d:
        X509_free((X509 *)conn->ssl[lVar13].server_cert);
        conn->ssl[lVar13].server_cert = (X509 *)0x0;
      }
      else {
        if ((conn->ssl_config).verifyhost == true) goto LAB_00511f7c;
LAB_00512901:
        pXVar24 = X509_get_issuer_name((X509 *)conn->ssl[lVar13].server_cert);
        iVar7 = x509_name_oneline((X509_NAME *)pXVar24,(char *)local_838,size_00);
        if (iVar7 == 0) {
          Curl_infof(pCVar59," issuer: %s\n",local_838);
          cVar2 = (conn->http_proxy).proxytype;
          if ((cVar2 == CURLPROXY_HTTPS) &&
             (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
            pcVar58 = (pCVar59->set).proxy_ssl.issuercert;
          }
          else {
            pcVar58 = (pCVar59->set).ssl.issuercert;
          }
          if (pcVar58 != (char *)0x0) {
            if ((cVar2 != CURLPROXY_HTTPS) ||
               (lVar48 = 0x528,
               conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
              lVar48 = 0x478;
            }
            pFVar35 = fopen64(*(char **)((long)pCVar59->sockets + lVar48 + -0x80),"r");
            if (pFVar35 == (FILE *)0x0) {
              if ((char)local_928 != '\0') {
                if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                   (lVar48 = 0x528,
                   conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                  lVar48 = 0x478;
                }
                Curl_failf(pCVar59,"SSL: Unable to open issuer cert (%s)",
                           *(undefined8 *)((long)pCVar59->sockets + lVar48 + -0x80));
              }
              pXVar23 = (X509 *)conn->ssl[lVar13].server_cert;
LAB_00512bbc:
              X509_free(pXVar23);
              conn->ssl[lVar13].server_cert = (X509 *)0x0;
            }
            else {
              pXVar23 = PEM_read_X509(pFVar35,(X509 **)0x0,(undefined1 *)0x0,(void *)0x0);
              if (pXVar23 != (X509 *)0x0) {
                fclose(pFVar35);
                iVar7 = X509_check_issued(pXVar23,(X509 *)conn->ssl[lVar13].server_cert);
                if (iVar7 == 0) {
                  if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                     (lVar48 = 0x528,
                     conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                    lVar48 = 0x478;
                  }
                  Curl_infof(pCVar59," SSL certificate issuer check ok (%s)\n",
                             *(undefined8 *)((long)pCVar59->sockets + lVar48 + -0x80));
                  X509_free(pXVar23);
                  goto LAB_00512e0e;
                }
                if ((char)local_928 != '\0') {
                  if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                     (lVar48 = 0x528,
                     conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                    lVar48 = 0x478;
                  }
                  Curl_failf(pCVar59,"SSL: Certificate issuer check failed (%s)",
                             *(undefined8 *)((long)pCVar59->sockets + lVar48 + -0x80));
                }
                X509_free((X509 *)conn->ssl[lVar13].server_cert);
                goto LAB_00512bbc;
              }
              if ((char)local_928 != '\0') {
                if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
                   (lVar48 = 0x528,
                   conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete)) {
                  lVar48 = 0x478;
                }
                Curl_failf(pCVar59,"SSL: Unable to read issuer cert (%s)",
                           *(undefined8 *)((long)pCVar59->sockets + lVar48 + -0x80));
              }
              X509_free((X509 *)conn->ssl[lVar13].server_cert);
              X509_free((X509 *)0x0);
              fclose(pFVar35);
            }
            CVar9 = CURLE_SSL_ISSUER_ERROR;
            goto LAB_005130ce;
          }
LAB_00512e0e:
          lVar48 = SSL_get_verify_result((SSL *)conn->ssl[lVar13].handle);
          *(long *)((long)pCVar59->sockets + local_8d8 + -0x80) = lVar48;
          if (lVar48 == 0) {
            CVar46 = CURLE_OK;
            Curl_infof(pCVar59," SSL certificate verify ok.\n");
          }
          else {
            if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
               (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
              if ((conn->proxy_ssl_config).verifypeer == false) {
LAB_00512eb1:
                pcVar58 = X509_verify_cert_error_string(lVar48);
                CVar46 = CURLE_OK;
                Curl_infof(pCVar59," SSL certificate verify result: %s (%ld), continuing anyway.\n",
                           pcVar58,lVar48);
                goto LAB_0051293b;
              }
            }
            else if ((conn->ssl_config).verifypeer != true) goto LAB_00512eb1;
            CVar46 = CURLE_PEER_FAILED_VERIFICATION;
            if ((char)local_928 != '\0') {
              pcVar58 = X509_verify_cert_error_string(lVar48);
              Curl_failf(pCVar59,"SSL certificate verify result: %s (%ld)",pcVar58,lVar48);
            }
          }
        }
        else {
          CVar46 = CURLE_SSL_CONNECT_ERROR;
          if ((char)local_928 != '\0') {
            Curl_failf(pCVar59,"SSL: couldn\'t get X509-issuer name!");
          }
        }
LAB_0051293b:
        if (((conn->http_proxy).proxytype == CURLPROXY_HTTPS) &&
           (conn->proxy_ssl[conn->sock[1] != -1].state != ssl_connection_complete)) {
          if ((conn->proxy_ssl_config).verifystatus != false) {
LAB_005129d6:
            pCVar3 = conn->data;
            lVar48 = SSL_ctrl((SSL *)conn->ssl[lVar13].handle,0x46,0,&local_8b8);
            if (local_8b8 == (SSL_SESSION *)0x0) {
              pcVar58 = "No OCSP response received";
LAB_00512b4e:
              resp = (OCSP_RESPONSE *)0x0;
              Curl_failf(pCVar3,pcVar58);
              CVar9 = CURLE_SSL_INVALIDCERTSTATUS;
              bs = (OCSP_BASICRESP *)0x0;
            }
            else {
              resp = d2i_OCSP_RESPONSE((OCSP_RESPONSE **)0x0,(uchar **)&local_8b8,lVar48);
              if (resp == (OCSP_RESPONSE *)0x0) {
                pcVar58 = "Invalid OCSP response";
                goto LAB_00512b4e;
              }
              uVar8 = OCSP_response_status(resp);
              if (uVar8 == 0) {
                bs = OCSP_response_get1_basic(resp);
                if (bs == (OCSP_BASICRESP *)0x0) {
                  pcVar58 = "Invalid OCSP response";
                  bs = (OCSP_BASICRESP *)0x0;
LAB_00512f24:
                  Curl_failf(pCVar3,pcVar58);
                  goto LAB_00512f2b;
                }
                psVar21 = SSL_get_peer_cert_chain((SSL *)conn->ssl[lVar13].handle);
                pXVar36 = SSL_CTX_get_cert_store((SSL_CTX *)conn->ssl[lVar13].ctx);
                CVar9 = CURLE_OK;
                iVar7 = OCSP_basic_verify(bs,psVar21,pXVar36,0);
                if (iVar7 < 1) {
                  pcVar58 = "OCSP response verification failed";
                  goto LAB_00512f24;
                }
                iVar7 = OCSP_resp_count(bs);
                if (0 < iVar7) {
                  iVar7 = 0;
                  CVar9 = CURLE_OK;
                  do {
                    single = OCSP_resp_get0(bs,iVar7);
                    if (single == (OCSP_SINGLERESP *)0x0) {
                      uVar8 = 5;
                    }
                    else {
                      uVar8 = OCSP_single_get0_status
                                        (single,(int *)&local_8e4,
                                         (ASN1_GENERALIZEDTIME **)&local_938,&local_948,&local_8f0);
                      iVar47 = OCSP_check_validity(local_948,local_8f0,300,-1);
                      if (iVar47 == 0) {
                        Curl_failf(pCVar3,"OCSP response has expired");
                        uVar8 = 2;
                        CVar9 = CURLE_SSL_INVALIDCERTSTATUS;
                      }
                      else {
                        pcVar58 = OCSP_cert_status_str((long)(int)uVar8);
                        Curl_infof(pCVar3,"SSL certificate status: %s (%d)\n",pcVar58,(ulong)uVar8);
                        if (uVar8 != 2) {
                          if (uVar8 != 1) {
                            uVar8 = 0;
                            goto LAB_00512d20;
                          }
                          pcVar58 = OCSP_crl_reason_str((long)(int)local_8e4);
                          Curl_failf(pCVar3,"SSL certificate revocation reason: %s (%d)",pcVar58,
                                     (ulong)local_8e4);
                          uVar8 = 2;
                        }
                        CVar9 = CURLE_SSL_INVALIDCERTSTATUS;
                      }
                    }
LAB_00512d20:
                    if ((uVar8 != 0) && (uVar8 != 5)) {
                      if (uVar8 != 2) goto LAB_00512f45;
                      break;
                    }
                    iVar7 = iVar7 + 1;
                    iVar47 = OCSP_resp_count(bs);
                  } while (iVar7 < iVar47);
                }
              }
              else {
                pcVar58 = OCSP_response_status_str((long)(int)uVar8);
                bs = (OCSP_BASICRESP *)0x0;
                Curl_failf(pCVar3,"Invalid OCSP response status: %s (%d)",pcVar58,(ulong)uVar8);
LAB_00512f2b:
                CVar9 = CURLE_SSL_INVALIDCERTSTATUS;
              }
            }
            if (bs != (OCSP_BASICRESP *)0x0) {
              OCSP_BASICRESP_free(bs);
            }
            OCSP_RESPONSE_free(resp);
LAB_00512f45:
            if (CVar9 != CURLE_OK) goto LAB_00512f4d;
            CVar46 = CURLE_OK;
          }
        }
        else if ((conn->ssl_config).verifystatus == true) goto LAB_005129d6;
        CVar9 = CURLE_OK;
        if ((char)local_928 != '\0') {
          CVar9 = CVar46;
        }
        if (((conn->http_proxy).proxytype != CURLPROXY_HTTPS) ||
           (lVar48 = 0x720, conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete))
        {
          lVar48 = 0x718;
        }
        pSVar34 = *(SSL_SESSION **)((long)pCVar59->sockets + lVar48 + -0x80);
        local_910 = pSVar34;
        if (pSVar34 != (SSL_SESSION *)0x0 && CVar9 == CURLE_OK) {
          pXVar31 = conn->ssl[lVar13].server_cert;
          local_8b8 = (SSL_SESSION *)0x0;
          if (pXVar31 == (X509 *)0x0) {
            CVar9 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
          }
          else {
            pXVar37 = (X509_PUBKEY *)X509_get_X509_PUBKEY(pXVar31);
            uVar8 = i2d_X509_PUBKEY(pXVar37,(uchar **)0x0);
            CVar9 = CURLE_SSL_PINNEDPUBKEYNOTMATCH;
            pSVar38 = (SSL_SESSION *)0x0;
            if (0 < (int)uVar8) {
              uVar16 = (ulong)uVar8;
              pSVar38 = (SSL_SESSION *)(*Curl_cmalloc)(uVar16);
              local_8b8 = pSVar38;
              if (pSVar38 == (SSL_SESSION *)0x0) {
                pSVar38 = (SSL_SESSION *)0x0;
              }
              else {
                pXVar37 = (X509_PUBKEY *)X509_get_X509_PUBKEY(pXVar31);
                uVar12 = i2d_X509_PUBKEY(pXVar37,(uchar **)&local_8b8);
                if ((local_8b8 != (SSL_SESSION *)0x0 && uVar8 == uVar12) &&
                    (long)local_8b8 - (long)pSVar38 == uVar16) {
                  CVar9 = Curl_pin_peer_pubkey(pCVar59,(char *)pSVar34,(uchar *)pSVar38,uVar16);
                }
              }
            }
            if (pSVar38 != (SSL_SESSION *)0x0) {
              (*Curl_cfree)(pSVar38);
            }
          }
          if (CVar9 == CURLE_OK) {
            CVar9 = CURLE_OK;
          }
          else {
            Curl_failf(pCVar59,"SSL: public key does not match pinned public key!");
          }
        }
        X509_free((X509 *)conn->ssl[lVar13].server_cert);
        conn->ssl[lVar13].server_cert = (X509 *)0x0;
        conn->ssl[lVar13].connecting_state = ssl_connect_done;
      }
    }
LAB_005130ce:
    if (CVar9 == CURLE_OK) {
      conn->ssl[lVar13].connecting_state = ssl_connect_done;
    }
  }
  if (CVar9 != CURLE_OK) {
    return CVar9;
  }
LAB_005130e3:
  bVar61 = conn->ssl[lVar13].connecting_state == ssl_connect_done;
  if (bVar61) {
    conn->ssl[lVar13].state = ssl_connection_complete;
    conn->recv[local_8c8] = ossl_recv;
    conn->send[local_8c8] = ossl_send;
  }
  *local_8c0 = bVar61;
  conn->ssl[lVar13].connecting_state = ssl_connect_1;
  return CURLE_OK;
}

Assistant:

static CURLcode ossl_connect_common(struct connectdata *conn,
                                    int sockindex,
                                    bool nonblocking,
                                    bool *done)
{
  CURLcode result;
  struct Curl_easy *data = conn->data;
  struct ssl_connect_data *connssl = &conn->ssl[sockindex];
  curl_socket_t sockfd = conn->sock[sockindex];
  time_t timeout_ms;
  int what;

  /* check if the connection has already been established */
  if(ssl_connection_complete == connssl->state) {
    *done = TRUE;
    return CURLE_OK;
  }

  if(ssl_connect_1 == connssl->connecting_state) {
    /* Find out how much more time we're allowed */
    timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    result = ossl_connect_step1(conn, sockindex);
    if(result)
      return result;
  }

  while(ssl_connect_2 == connssl->connecting_state ||
        ssl_connect_2_reading == connssl->connecting_state ||
        ssl_connect_2_writing == connssl->connecting_state) {

    /* check allowed time left */
    timeout_ms = Curl_timeleft(data, NULL, TRUE);

    if(timeout_ms < 0) {
      /* no need to continue if time already is up */
      failf(data, "SSL connection timeout");
      return CURLE_OPERATION_TIMEDOUT;
    }

    /* if ssl is expecting something, check if it's available. */
    if(connssl->connecting_state == ssl_connect_2_reading ||
       connssl->connecting_state == ssl_connect_2_writing) {

      curl_socket_t writefd = ssl_connect_2_writing==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;
      curl_socket_t readfd = ssl_connect_2_reading==
        connssl->connecting_state?sockfd:CURL_SOCKET_BAD;

      what = Curl_socket_check(readfd, CURL_SOCKET_BAD, writefd,
                               nonblocking?0:timeout_ms);
      if(what < 0) {
        /* fatal error */
        failf(data, "select/poll on SSL socket, errno: %d", SOCKERRNO);
        return CURLE_SSL_CONNECT_ERROR;
      }
      if(0 == what) {
        if(nonblocking) {
          *done = FALSE;
          return CURLE_OK;
        }
        /* timeout */
        failf(data, "SSL connection timeout");
        return CURLE_OPERATION_TIMEDOUT;
      }
      /* socket is readable or writable */
    }

    /* Run transaction, and return to the caller if it failed or if this
     * connection is done nonblocking and this loop would execute again. This
     * permits the owner of a multi handle to abort a connection attempt
     * before step2 has completed while ensuring that a client using select()
     * or epoll() will always have a valid fdset to wait on.
     */
    result = ossl_connect_step2(conn, sockindex);
    if(result || (nonblocking &&
                  (ssl_connect_2 == connssl->connecting_state ||
                   ssl_connect_2_reading == connssl->connecting_state ||
                   ssl_connect_2_writing == connssl->connecting_state)))
      return result;

  } /* repeat step2 until all transactions are done. */

  if(ssl_connect_3 == connssl->connecting_state) {
    result = ossl_connect_step3(conn, sockindex);
    if(result)
      return result;
  }

  if(ssl_connect_done == connssl->connecting_state) {
    connssl->state = ssl_connection_complete;
    conn->recv[sockindex] = ossl_recv;
    conn->send[sockindex] = ossl_send;
    *done = TRUE;
  }
  else
    *done = FALSE;

  /* Reset our connect state machine */
  connssl->connecting_state = ssl_connect_1;

  return CURLE_OK;
}